

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::ConstantNamePrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view classname)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  allocator<char> local_a1;
  undefined4 local_a0;
  allocator<char> local_99;
  size_t local_98;
  char *local_90;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_88;
  int local_78;
  int i;
  string_view local_68;
  _anonymous_namespace_ *local_58;
  size_t sStack_50;
  undefined1 local_48 [8];
  string lower;
  bool is_reserved;
  string_view classname_local;
  
  sStack_50 = classname._M_len;
  lower.field_2._M_local_buf[0xf] = '\0';
  local_58 = this;
  absl::lts_20250127::AsciiStrToLower_abi_cxx11_((string *)local_48,(lts_20250127 *)this,classname);
  local_68 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
  lower.field_2._M_local_buf[0xf] = IsReservedName(local_68);
  local_78 = 0;
  do {
    if (0xb < local_78) {
LAB_00229d61:
      if ((lower.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_a1);
        std::allocator<char>::~allocator(&local_a1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"PB",&local_99);
        std::allocator<char>::~allocator(&local_99);
      }
      local_a0 = 1;
      std::__cxx11::string::~string((string *)local_48);
      return __return_storage_ptr__;
    }
    __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
    local_98 = kValidConstantNames[local_78]._M_len;
    local_90 = kValidConstantNames[local_78]._M_str;
    local_88 = __x;
    bVar1 = std::operator==(__x,kValidConstantNames[local_78]);
    if (bVar1) {
      lower.field_2._M_local_buf[0xf] = '\0';
      goto LAB_00229d61;
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

std::string ConstantNamePrefix(absl::string_view classname) {
  bool is_reserved = false;

  std::string lower = absl::AsciiStrToLower(classname);

  is_reserved = IsReservedName(lower);

  for (int i = 0; i < kValidConstantNamesSize; i++) {
    if (lower == kValidConstantNames[i]) {
      is_reserved = false;
      break;
    }
  }

  if (is_reserved) {
    return "PB";
  }

  return "";
}